

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FieldDescriptorProto::SharedCtor(FieldDescriptorProto *this)

{
  internal::InitSCC(&scc_info_FieldDescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base);
  (this->name_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->extendee_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->type_name_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->default_value_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  (this->json_name_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  this->options_ = (FieldOptions *)0x0;
  this->number_ = 0;
  this->oneof_index_ = 0;
  this->label_ = 1;
  this->type_ = 1;
  return;
}

Assistant:

void FieldDescriptorProto::SharedCtor() {
  ::PROTOBUF_NAMESPACE_ID::internal::InitSCC(&scc_info_FieldDescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  extendee_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  type_name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  default_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  json_name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  ::memset(&options_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&oneof_index_) -
      reinterpret_cast<char*>(&options_)) + sizeof(oneof_index_));
  label_ = 1;
  type_ = 1;
}